

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O3

bool __thiscall
XPMP2::RmtMsgBufTy<XPMP2::RemoteAcPosUpdateTy,_(XPMP2::RemoteMsgTy)4,_(unsigned_char)'\x00'>::add
          (RmtMsgBufTy<XPMP2::RemoteAcPosUpdateTy,_(XPMP2::RemoteMsgTy)4,_(unsigned_char)__x00_>
           *this,RemoteAcPosUpdateTy *_elem)

{
  undefined8 *puVar1;
  size_t sVar2;
  void *pvVar3;
  undefined8 uVar4;
  ulong uVar5;
  
  if (this->pMsg == (void *)0x0) {
    init(this,(EVP_PKEY_CTX *)_elem);
  }
  sVar2 = this->size;
  uVar5 = DAT_002ec768 - sVar2;
  if (0x13 < uVar5) {
    pvVar3 = this->pMsg;
    *(undefined4 *)((long)pvVar3 + sVar2 + 0x10) = *(undefined4 *)&_elem->roll;
    uVar4 = *(undefined8 *)&_elem->dAlt_ft;
    puVar1 = (undefined8 *)((long)pvVar3 + sVar2);
    *puVar1 = *(undefined8 *)_elem;
    puVar1[1] = uVar4;
    this->elemCount = this->elemCount + 1;
    this->size = this->size + 0x14;
  }
  return 0x13 < uVar5;
}

Assistant:

bool RmtMsgBufTy<ElemTy,MsgTy,msgVer>::add (const ElemTy& _elem)
{
    // no buffer defined yet? -> do so!
    if (!pMsg) init();
        
    // no space left?
    const size_t elemSize = _elem.msgSize();
    if (glob.remoteBufSize - size < elemSize)
        return false;
    
    // Copy the element into the msg buffer
    memcpy(reinterpret_cast<char*>(pMsg) + size, &_elem, elemSize);
    ++elemCount;
    size += elemSize;
    return true;
}